

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

void xmlWriterErrMsg(xmlTextWriterPtr ctxt,xmlParserErrors error,char *msg)

{
  char *msg_local;
  xmlParserErrors error_local;
  xmlTextWriterPtr ctxt_local;
  
  if (ctxt == (xmlTextWriterPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x19,error,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s",msg);
  }
  else {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,ctxt->ctxt,
                    (void *)0x0,0x19,error,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s",msg);
  }
  return;
}

Assistant:

static void
xmlWriterErrMsg(xmlTextWriterPtr ctxt, xmlParserErrors error,
               const char *msg)
{
    if (ctxt != NULL) {
	__xmlRaiseError(NULL, NULL, NULL, ctxt->ctxt,
	            NULL, XML_FROM_WRITER, error, XML_ERR_FATAL,
		    NULL, 0, NULL, NULL, NULL, 0, 0, "%s", msg);
    } else {
	__xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_WRITER, error,
                    XML_ERR_FATAL, NULL, 0, NULL, NULL, NULL, 0, 0, "%s", msg);
    }
}